

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptFunction.cpp
# Opt level: O0

Var Js::JavascriptFunction::NewInstanceHelper
              (ScriptContext *scriptContext,RecyclableObject *function,CallInfo callInfo,
              ArgumentReader *args,FunctionKind functionKind)

{
  ExecutionInfoManager *this;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  charcount_t cVar4;
  uint32 uVar5;
  undefined4 *puVar6;
  JavascriptString *pJVar7;
  JavascriptString *pJVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  GlobalObject *pGVar9;
  ParseableFunctionInfo *pPVar10;
  FunctionInfo *pFVar11;
  FunctionProxy *pFVar12;
  FunctionBody *body;
  TopLevelNewFunctionBodyResolveInfo *pTVar13;
  ThreadContext *pTVar14;
  Utf8SourceInfo *pUVar15;
  JavascriptLibrary *pJVar16;
  RecyclableObject *pRVar17;
  FunctionInfo *local_1e0;
  JavascriptGeneratorFunction *local_1d8;
  JavascriptGeneratorFunction *local_1d0;
  JavascriptString *local_158;
  JavascriptString *local_150;
  JavascriptString *local_148;
  bool local_12a;
  bool local_129;
  JavascriptGeneratorFunction *pfuncGen;
  GeneratorVirtualScriptFunction *pfuncVirt;
  TopLevelNewFunctionBodyResolveInfo *tbfi;
  uint32 bodyIdCtr;
  FunctionBody *globalBody;
  ParseableFunctionInfo *functionInfo;
  undefined1 local_d8 [8];
  EvalMapString key;
  charcount_t sourceLen;
  char16 *sourceString;
  FunctionInfo *pfuncInfoCache;
  JavascriptFunction *pfuncScript;
  BOOL strictMode;
  ModuleID moduleID;
  JavascriptString *bs;
  JavascriptString *fnBody;
  JavascriptString *pJStack_70;
  uint i;
  JavascriptString *formals;
  JavascriptString *separator;
  byte local_49;
  Var pvStack_48;
  bool isCtorSuperCall;
  Var newTarget;
  bool isGenerator;
  JavascriptLibrary *pJStack_38;
  bool isAsync;
  JavascriptLibrary *library;
  Arguments *pAStack_28;
  FunctionKind functionKind_local;
  ArgumentReader *args_local;
  RecyclableObject *function_local;
  ScriptContext *scriptContext_local;
  CallInfo callInfo_local;
  char16 *content;
  
  library._4_4_ = functionKind;
  pAStack_28 = &args->super_Arguments;
  args_local = (ArgumentReader *)function;
  function_local = (RecyclableObject *)scriptContext;
  scriptContext_local = (ScriptContext *)callInfo;
  pJStack_38 = RecyclableObject::GetLibrary(function);
  if (((ulong)((Arguments *)&pAStack_28->Info)->Info & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptFunction.cpp"
                                ,0x85,"(args.Info.Count > 0)","Should always have implicit \'this\'"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  local_129 = library._4_4_ == Async || library._4_4_ == AsyncGenerator;
  newTarget._7_1_ = local_129;
  local_12a = library._4_4_ == Generator || library._4_4_ == AsyncGenerator;
  newTarget._6_1_ = local_12a;
  pvStack_48 = Arguments::GetNewTarget(pAStack_28);
  Arguments::Arguments((Arguments *)&separator,pAStack_28);
  local_49 = Js::JavascriptOperators::GetAndAssertIsConstructorSuperCall((Arguments *)&separator);
  formals = JavascriptLibrary::GetCommaDisplayString(pJStack_38);
  pJStack_70 = JavascriptLibrary::GetOpenRBracketString(pJStack_38);
  for (fnBody._4_4_ = 1; pJVar8 = pJStack_70,
      fnBody._4_4_ < (SUB84(pAStack_28->Info,0) & 0xffffff) - 1; fnBody._4_4_ = fnBody._4_4_ + 1) {
    if (fnBody._4_4_ != 1) {
      pJStack_70 = JavascriptString::Concat(pJStack_70,formals);
    }
    pJVar8 = pJStack_70;
    pJVar7 = JavascriptConversion::ToString
                       (pAStack_28->Values[fnBody._4_4_],(ScriptContext *)function_local);
    pJStack_70 = JavascriptString::Concat(pJVar8,pJVar7);
  }
  pJVar7 = JavascriptLibrary::GetNewLineCloseRBracketString(pJStack_38);
  pJStack_70 = JavascriptString::Concat(pJVar8,pJVar7);
  bs = (JavascriptString *)0x0;
  if ((SUB84(pAStack_28->Info,0) & 0xffffff) != 1 && ((ulong)pAStack_28->Info & 0xffffff) != 0) {
    bs = JavascriptConversion::ToString
                   (pAStack_28->Values[(int)((SUB84(pAStack_28->Info,0) & 0xffffff) - 1)],
                    (ScriptContext *)function_local);
  }
  if (library._4_4_ == Async) {
    local_148 = JavascriptLibrary::GetAsyncFunctionAnonymousString(pJStack_38);
  }
  else {
    if (library._4_4_ == Generator) {
      local_150 = JavascriptLibrary::GetFunctionPTRAnonymousString(pJStack_38);
    }
    else {
      if (library._4_4_ == AsyncGenerator) {
        local_158 = JavascriptLibrary::GetAsyncGeneratorAnonymousString(pJStack_38);
      }
      else {
        local_158 = JavascriptLibrary::GetFunctionAnonymousString(pJStack_38);
      }
      local_150 = local_158;
    }
    local_148 = local_150;
  }
  _strictMode = local_148;
  pJVar8 = JavascriptString::Concat(local_148,pJStack_70);
  _strictMode = pJVar8;
  pJVar7 = JavascriptLibrary::GetSpaceOpenBracketString(pJStack_38);
  _strictMode = JavascriptString::Concat(pJVar8,pJVar7);
  if (bs != (JavascriptString *)0x0) {
    _strictMode = JavascriptString::Concat(_strictMode,bs);
  }
  pJVar8 = _strictMode;
  pJVar7 = JavascriptLibrary::GetNewLineCloseBracketString(pJStack_38);
  _strictMode = JavascriptString::Concat(pJVar8,pJVar7);
  pfuncScript._4_4_ = 0;
  pfuncScript._0_4_ = 0;
  sourceString = (char16 *)0x0;
  iVar3 = (*(_strictMode->super_RecyclableObject).super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])();
  content = (char16 *)CONCAT44(extraout_var,iVar3);
  key.isLibraryCode = JavascriptString::GetLength(_strictMode);
  EvalMapStringInternal<false>::EvalMapStringInternal
            ((EvalMapStringInternal<false> *)local_d8,(FinalizableObject *)_strictMode,content,
             key.isLibraryCode,pfuncScript._4_4_,(BOOL)pfuncScript,0);
  bVar2 = ScriptContext::IsInNewFunctionMap
                    ((ScriptContext *)function_local,(EvalMapString *)local_d8,
                     (FunctionInfo **)&sourceString);
  if (bVar2) {
    bVar2 = FunctionInfo::IsCoroutine((FunctionInfo *)sourceString);
    if (bVar2) {
      pJVar16 = ScriptContext::GetLibrary((ScriptContext *)function_local);
      pFVar12 = FunctionInfo::GetFunctionProxy((FunctionInfo *)sourceString);
      pfuncInfoCache =
           (FunctionInfo *)JavascriptLibrary::CreateGeneratorVirtualScriptFunction(pJVar16,pFVar12);
    }
    else {
      pJVar16 = ScriptContext::GetLibrary((ScriptContext *)function_local);
      pFVar12 = FunctionInfo::GetFunctionProxy((FunctionInfo *)sourceString);
      pfuncInfoCache = (FunctionInfo *)JavascriptLibrary::CreateScriptFunction(pJVar16,pFVar12);
    }
  }
  else {
    ScriptContextBase::GetGlobalObject((ScriptContextBase *)&function_local->type);
    pRVar17 = function_local;
    iVar3 = (*(pJStack_70->super_RecyclableObject).super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])();
    cVar4 = JavascriptString::GetLength(pJStack_70);
    GlobalObject::ValidateSyntax
              ((GlobalObject *)pRVar17,(ScriptContext *)CONCAT44(extraout_var_00,iVar3),
               (char16 *)(ulong)cVar4,(uint)(newTarget._6_1_ & 1),(bool)(newTarget._7_1_ & 1),true,
               0x1527f40);
    if (bs != (JavascriptString *)0x0) {
      ScriptContextBase::GetGlobalObject((ScriptContextBase *)&function_local->type);
      pRVar17 = function_local;
      iVar3 = (*(bs->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x65])();
      cVar4 = JavascriptString::GetLength(bs);
      GlobalObject::ValidateSyntax
                ((GlobalObject *)pRVar17,(ScriptContext *)CONCAT44(extraout_var_01,iVar3),
                 (char16 *)(ulong)cVar4,(uint)(newTarget._6_1_ & 1),(bool)(newTarget._7_1_ & 1),true
                 ,0x1527f90);
    }
    pGVar9 = ScriptContextBase::GetGlobalObject((ScriptContextBase *)&function_local->type);
    pfuncInfoCache =
         (FunctionInfo *)
         (*pGVar9->EvalHelper)
                   ((ScriptContext *)function_local,content,key.isLibraryCode,pfuncScript._4_4_,0x10
                    ,L"Function code",1,1,(BOOL)pfuncScript);
    pPVar10 = GetParseableFunctionInfo((JavascriptFunction *)pfuncInfoCache);
    if (pPVar10 == (ParseableFunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptFunction.cpp"
                                  ,0xdc,"(functionInfo)","functionInfo");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    uVar5 = ParseableFunctionInfo::GetGrfscr(pPVar10);
    ParseableFunctionInfo::SetGrfscr(pPVar10,uVar5 | 0x1000);
    bVar2 = ScriptContext::IsTTDRecordOrReplayModeEnabled((ScriptContext *)function_local);
    pRVar17 = function_local;
    if (!bVar2) {
      pFVar11 = FunctionProxy::GetFunctionInfo(&pPVar10->super_FunctionProxy);
      ScriptContext::AddToNewFunctionMap((ScriptContext *)pRVar17,(EvalMapString *)local_d8,pFVar11)
      ;
    }
  }
  if ((pfuncInfoCache != (FunctionInfo *)0x0) &&
     ((bVar2 = ScriptContext::IsTTDRecordModeEnabled((ScriptContext *)function_local), bVar2 ||
      (bVar2 = ScriptContext::ShouldPerformReplayAction((ScriptContext *)function_local), bVar2))))
  {
    pPVar10 = GetParseableFunctionInfo((JavascriptFunction *)pfuncInfoCache);
    body = TTD::JsSupport::ForceAndGetFunctionBody(pPVar10);
    bVar2 = TTD::ScriptContextTTD::IsBodyAlreadyLoadedAtTopLevel
                      ((ScriptContextTTD *)
                       function_local[0x143].super_FinalizableObject.super_IRecyclerVisitedObject.
                       _vptr_IRecyclerVisitedObject,body);
    if (!bVar2) {
      tbfi._4_4_ = 0;
      bVar2 = ScriptContext::IsTTDRecordModeEnabled((ScriptContext *)function_local);
      if (bVar2) {
        pTVar14 = ScriptContext::GetThreadContext((ScriptContext *)function_local);
        pTVar13 = TTD::EventLog::AddNewFunction
                            (pTVar14->TTDLog,body,pfuncScript._4_4_,content,key.isLibraryCode);
        bVar2 = ScriptContext::ShouldPerformRecordAction((ScriptContext *)function_local);
        if (bVar2) {
          pTVar14 = ScriptContext::GetThreadContext((ScriptContext *)function_local);
          TTD::EventLog::RecordTopLevelCodeAction
                    (pTVar14->TTDLog,(pTVar13->TopLevelBase).TopLevelBodyCtr);
        }
        tbfi._4_4_ = (pTVar13->TopLevelBase).TopLevelBodyCtr;
      }
      bVar2 = ScriptContext::ShouldPerformReplayAction((ScriptContext *)function_local);
      if (bVar2) {
        pTVar14 = ScriptContext::GetThreadContext((ScriptContext *)function_local);
        tbfi._4_4_ = TTD::EventLog::ReplayTopLevelCodeAction(pTVar14->TTDLog);
      }
      TTD::ScriptContextTTD::ProcessFunctionBodyOnLoad
                ((ScriptContextTTD *)
                 function_local[0x143].super_FinalizableObject.super_IRecyclerVisitedObject.
                 _vptr_IRecyclerVisitedObject,body,(FunctionBody *)0x0);
      TTD::ScriptContextTTD::RegisterNewScript
                ((ScriptContextTTD *)
                 function_local[0x143].super_FinalizableObject.super_IRecyclerVisitedObject.
                 _vptr_IRecyclerVisitedObject,body,tbfi._4_4_);
      bVar2 = ScriptContext::ShouldPerformRecordOrReplayAction((ScriptContext *)function_local);
      if (bVar2) {
        pUVar15 = FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)body);
        Utf8SourceInfo::SetSourceInfoForDebugReplay_TTD(pUVar15,tbfi._4_4_);
      }
      bVar2 = ScriptContext::ShouldPerformReplayDebuggerAction((ScriptContext *)function_local);
      if (bVar2) {
        pTVar14 = ScriptContext::GetThreadContext((ScriptContext *)function_local);
        pRVar17 = function_local;
        this = pTVar14->TTDExecutionInfo;
        pUVar15 = FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)body);
        TTD::ExecutionInfoManager::ProcessScriptLoad
                  (this,(ScriptContext *)pRVar17,tbfi._4_4_,body,pUVar15,
                   (CompileScriptException *)0x0);
      }
    }
  }
  if (((newTarget._6_1_ & 1) != 0) || ((newTarget._7_1_ & 1) != 0)) {
    pFVar11 = GetFunctionInfo((JavascriptFunction *)pfuncInfoCache);
    bVar2 = FunctionInfo::IsCoroutine(pFVar11);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptFunction.cpp"
                                  ,0x124,"(pfuncScript->GetFunctionInfo()->IsCoroutine())",
                                  "pfuncScript->GetFunctionInfo()->IsCoroutine()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    pFVar11 = pfuncInfoCache;
    if (library._4_4_ == Async) {
      pJVar16 = ScriptContext::GetLibrary((ScriptContext *)function_local);
      local_1d0 = &JavascriptLibrary::CreateAsyncFunction
                             (pJVar16,JavascriptAsyncFunction::EntryAsyncFunctionImplementation,
                              (GeneratorVirtualScriptFunction *)pFVar11)->
                   super_JavascriptGeneratorFunction;
    }
    else {
      if (library._4_4_ == AsyncGenerator) {
        pJVar16 = ScriptContext::GetLibrary((ScriptContext *)function_local);
        local_1d8 = &JavascriptLibrary::CreateAsyncGeneratorFunction
                               (pJVar16,JavascriptAsyncGeneratorFunction::
                                        EntryAsyncGeneratorFunctionImplementation,
                                (GeneratorVirtualScriptFunction *)pFVar11)->
                     super_JavascriptGeneratorFunction;
      }
      else {
        pJVar16 = ScriptContext::GetLibrary((ScriptContext *)function_local);
        local_1d8 = JavascriptLibrary::CreateGeneratorFunction
                              (pJVar16,JavascriptGeneratorFunction::
                                       EntryGeneratorFunctionImplementation,
                               (GeneratorVirtualScriptFunction *)pFVar11);
      }
      local_1d0 = local_1d8;
    }
    GeneratorVirtualScriptFunction::SetRealGeneratorFunction
              ((GeneratorVirtualScriptFunction *)pFVar11,local_1d0);
    pfuncInfoCache = (FunctionInfo *)local_1d0;
  }
  if ((local_49 & 1) == 0) {
    local_1e0 = pfuncInfoCache;
  }
  else {
    pRVar17 = VarTo<Js::RecyclableObject>(pvStack_48);
    local_1e0 = (FunctionInfo *)
                Js::JavascriptOperators::OrdinaryCreateFromConstructor
                          (pRVar17,(RecyclableObject *)pfuncInfoCache,(DynamicObject *)0x0,
                           (ScriptContext *)function_local);
  }
  return local_1e0;
}

Assistant:

Var JavascriptFunction::NewInstanceHelper(ScriptContext *scriptContext, RecyclableObject* function, CallInfo callInfo, Js::ArgumentReader& args, FunctionKind functionKind /* = FunctionKind::Normal */)
    {
        JavascriptLibrary* library = function->GetLibrary();

        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");

        bool isAsync = functionKind == FunctionKind::Async || functionKind == FunctionKind::AsyncGenerator;
        bool isGenerator = functionKind == FunctionKind::Generator || functionKind == FunctionKind::AsyncGenerator;

        // SkipDefaultNewObject function flag should have prevented the default object from
        // being created, except when call true a host dispatch.
        Var newTarget = args.GetNewTarget();
        bool isCtorSuperCall = JavascriptOperators::GetAndAssertIsConstructorSuperCall(args);

        JavascriptString* separator = library->GetCommaDisplayString();

        // Gather all the formals into a string like (fml1, fml2, fml3)
        JavascriptString *formals = library->GetOpenRBracketString();

        for (uint i = 1; i < args.Info.Count - 1; ++i)
        {
            if (i != 1)
            {
                formals = JavascriptString::Concat(formals, separator);
            }
            formals = JavascriptString::Concat(formals, JavascriptConversion::ToString(args.Values[i], scriptContext));
        }
        formals = JavascriptString::Concat(formals, library->GetNewLineCloseRBracketString());
        // Function body, last argument to Function(...)
        JavascriptString *fnBody = NULL;
        if (args.Info.Count > 1)
        {
            fnBody = JavascriptConversion::ToString(args.Values[args.Info.Count - 1], scriptContext);
        }

        // Create a string representing the anonymous function
        Assert(
            0 + // "function anonymous" GetFunctionAnonymousString
            0 + // "("   GetOpenRBracketString
            1 + // "\n)" GetNewLineCloseRBracketString
            0 // " {"  GetSpaceOpenBracketString
            == numberLinesPrependedToAnonymousFunction); // Be sure to add exactly one line to anonymous function

        JavascriptString *bs = functionKind == FunctionKind::Async ?
            library->GetAsyncFunctionAnonymousString() :
            functionKind == FunctionKind::Generator ?
            library->GetFunctionPTRAnonymousString() :
            functionKind == FunctionKind::AsyncGenerator ?
            library->GetAsyncGeneratorAnonymousString() :
            library->GetFunctionAnonymousString();

        bs = JavascriptString::Concat(bs, formals);
        bs = JavascriptString::Concat(bs, library->GetSpaceOpenBracketString());
        if (fnBody != NULL)
        {
            bs = JavascriptString::Concat(bs, fnBody);
        }

        bs = JavascriptString::Concat(bs, library->GetNewLineCloseBracketString());
        // Bug 1105479. Get the module id from the caller
        ModuleID moduleID = kmodGlobal;

        BOOL strictMode = FALSE;

        JavascriptFunction* pfuncScript;
        FunctionInfo *pfuncInfoCache = NULL;
        char16 const * sourceString = bs->GetSz();
        charcount_t sourceLen = bs->GetLength();
        EvalMapString key(bs, sourceString, sourceLen, moduleID, strictMode, /* isLibraryCode = */ false);
        if (!scriptContext->IsInNewFunctionMap(key, &pfuncInfoCache))
        {
            // Validate formals here
            scriptContext->GetGlobalObject()->ValidateSyntax(
                scriptContext, formals->GetSz(), formals->GetLength(),
                isGenerator, isAsync,
                &Parser::ValidateFormals);
            if (fnBody != NULL)
            {
                // Validate function body
                scriptContext->GetGlobalObject()->ValidateSyntax(
                    scriptContext, fnBody->GetSz(), fnBody->GetLength(),
                    isGenerator, isAsync,
                    &Parser::ValidateSourceElementList);
            }

            pfuncScript = scriptContext->GetGlobalObject()->EvalHelper(scriptContext, sourceString, sourceLen, moduleID, fscrCanDeferFncParse, Constants::FunctionCode, TRUE, TRUE, strictMode);

            // Indicate that this is a top-level function. We don't pass the fscrGlobalCode flag to the eval helper,
            // or it will return the global function that wraps the declared function body, as though it were an eval.
            // But we want, for instance, to be able to verify that we did the right amount of deferred parsing.
            ParseableFunctionInfo *functionInfo = pfuncScript->GetParseableFunctionInfo();
            Assert(functionInfo);
            functionInfo->SetGrfscr(functionInfo->GetGrfscr() | fscrGlobalCode);

#if ENABLE_TTD
            if(!scriptContext->IsTTDRecordOrReplayModeEnabled())
            {
                scriptContext->AddToNewFunctionMap(key, functionInfo->GetFunctionInfo());
            }
#else
            scriptContext->AddToNewFunctionMap(key, functionInfo->GetFunctionInfo());
#endif
        }
        else if (pfuncInfoCache->IsCoroutine())
        {
            pfuncScript = scriptContext->GetLibrary()->CreateGeneratorVirtualScriptFunction(pfuncInfoCache->GetFunctionProxy());
        }
        else
        {
            pfuncScript = scriptContext->GetLibrary()->CreateScriptFunction(pfuncInfoCache->GetFunctionProxy());
        }

#if ENABLE_TTD
        //
        //TODO: We may (probably?) want to use the debugger source rundown functionality here instead
        //
        if(pfuncScript != nullptr && (scriptContext->IsTTDRecordModeEnabled() || scriptContext->ShouldPerformReplayAction()))
        {
            //Make sure we have the body and text information available
            FunctionBody* globalBody = TTD::JsSupport::ForceAndGetFunctionBody(pfuncScript->GetParseableFunctionInfo());
            if(!scriptContext->TTDContextInfo->IsBodyAlreadyLoadedAtTopLevel(globalBody))
            {
                uint32 bodyIdCtr = 0;

                if(scriptContext->IsTTDRecordModeEnabled())
                {
                    const TTD::NSSnapValues::TopLevelNewFunctionBodyResolveInfo* tbfi = scriptContext->GetThreadContext()->TTDLog->AddNewFunction(globalBody, moduleID, sourceString, sourceLen);

                    //We always want to register the top-level load but we don't always need to log the event
                    if(scriptContext->ShouldPerformRecordAction())
                    {
                        scriptContext->GetThreadContext()->TTDLog->RecordTopLevelCodeAction(tbfi->TopLevelBase.TopLevelBodyCtr);
                    }

                    bodyIdCtr = tbfi->TopLevelBase.TopLevelBodyCtr;
                }

                if(scriptContext->ShouldPerformReplayAction())
                {
                    bodyIdCtr = scriptContext->GetThreadContext()->TTDLog->ReplayTopLevelCodeAction();
                }

                //walk global body to (1) add functions to pin set (2) build parent map
                scriptContext->TTDContextInfo->ProcessFunctionBodyOnLoad(globalBody, nullptr);
                scriptContext->TTDContextInfo->RegisterNewScript(globalBody, bodyIdCtr);

                if(scriptContext->ShouldPerformRecordOrReplayAction())
                {
                    globalBody->GetUtf8SourceInfo()->SetSourceInfoForDebugReplay_TTD(bodyIdCtr);
                }

                if(scriptContext->ShouldPerformReplayDebuggerAction())
                {
                    scriptContext->GetThreadContext()->TTDExecutionInfo->ProcessScriptLoad(scriptContext, bodyIdCtr, globalBody, globalBody->GetUtf8SourceInfo(), nullptr);
                }
            }
        }
#endif

        JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_FUNCTION(pfuncScript, EtwTrace::GetFunctionId(pfuncScript->GetFunctionProxy())));

        if (isGenerator || isAsync)
        {
            Assert(pfuncScript->GetFunctionInfo()->IsCoroutine());
            auto pfuncVirt = static_cast<GeneratorVirtualScriptFunction*>(pfuncScript);
            auto pfuncGen = functionKind == FunctionKind::Async ?
                scriptContext->GetLibrary()->CreateAsyncFunction(JavascriptAsyncFunction::EntryAsyncFunctionImplementation, pfuncVirt) :
                functionKind == FunctionKind::AsyncGenerator ?
                scriptContext->GetLibrary()->CreateAsyncGeneratorFunction(JavascriptAsyncGeneratorFunction::EntryAsyncGeneratorFunctionImplementation, pfuncVirt) :
                scriptContext->GetLibrary()->CreateGeneratorFunction(JavascriptGeneratorFunction::EntryGeneratorFunctionImplementation, pfuncVirt);
            pfuncVirt->SetRealGeneratorFunction(pfuncGen);
            pfuncScript = pfuncGen;
        }

        return isCtorSuperCall ?
            JavascriptOperators::OrdinaryCreateFromConstructor(VarTo<RecyclableObject>(newTarget), pfuncScript, nullptr, scriptContext) :
            pfuncScript;
    }